

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ss_mintrosort(uchar *T,int *PA,int *first,int *last,int depth)

{
  byte bVar1;
  byte bVar2;
  undefined4 uVar3;
  uchar *puVar4;
  ulong uVar5;
  uint *puVar6;
  uint *puVar7;
  int iVar8;
  int iVar9;
  uchar *puVar10;
  uchar *puVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  uint *puVar16;
  uint uVar17;
  byte bVar19;
  uint *puVar18;
  byte bVar20;
  byte *pbVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  uint *puVar27;
  uint *puVar28;
  uint *puVar29;
  uint *puVar30;
  byte bVar31;
  uint uVar32;
  int iVar33;
  byte *pbVar34;
  int v;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  byte *pbVar39;
  int iVar40;
  ulong uVar41;
  bool bVar42;
  bool bVar43;
  anon_struct_24_4_d8a55aef stack [16];
  ulong local_208;
  ulong auStack_1b8 [2];
  int aiStack_1a8 [94];
  ulong uVar26;
  
  uVar17 = (uint)((long)last - (long)first);
  if (((long)last - (long)first & 0x3fc00U) == 0) {
    iVar8 = *(int *)((long)lg_table + (ulong)(uVar17 & 0x3fc));
  }
  else {
    iVar8 = *(int *)((long)lg_table + (ulong)(uVar17 >> 8 & 0x3fc)) + 8;
  }
  local_208 = 0;
  iVar40 = 2;
  bVar20 = 0;
LAB_001e2eef:
  do {
    uVar5 = (long)last - (long)first;
    uVar38 = (long)uVar5 >> 2;
    puVar18 = (uint *)last;
    puVar6 = (uint *)first;
    iVar23 = iVar8;
    if ((long)uVar38 < 9) {
      local_208 = local_208 & 0xffffffff;
      do {
        if ((1 < (long)uVar38) && (puVar6 = (uint *)last + -2, first <= puVar6)) {
          puVar10 = T + iVar40;
LAB_001e2f80:
          uVar17 = *puVar6;
          puVar18 = puVar6 + 1;
          do {
            lVar22 = (long)PA[(int)uVar17];
            pbVar21 = puVar10 + lVar22;
            lVar12 = (long)PA[(int)*puVar18];
            pbVar39 = puVar10 + lVar12;
            pbVar34 = T + (long)PA[(long)(int)*puVar18 + 1] + 2;
            bVar42 = pbVar39 < pbVar34;
            bVar43 = pbVar21 < T + (long)PA[(long)(int)uVar17 + 1] + 2;
            if ((bVar43) && (pbVar39 < pbVar34)) {
              bVar43 = true;
              bVar42 = true;
              if (*pbVar21 == *pbVar39) {
                puVar4 = puVar10;
                do {
                  puVar11 = puVar4;
                  pbVar21 = puVar11 + lVar12 + 1;
                  bVar42 = pbVar21 < pbVar34;
                  bVar43 = puVar11 + lVar22 + 1 < T + (long)PA[(long)(int)uVar17 + 1] + 2;
                  if ((!bVar43) || (pbVar34 <= pbVar21)) goto LAB_001e3022;
                  puVar4 = puVar11 + 1;
                } while (puVar11[lVar22 + 1] == *pbVar21);
                bVar43 = true;
                bVar42 = true;
LAB_001e3022:
                pbVar39 = puVar11 + lVar12 + 1;
                pbVar21 = puVar11 + lVar22 + 1;
              }
            }
            if (bVar43) {
              iVar8 = 1;
              if (bVar42 != false) {
                iVar8 = (uint)*pbVar21 - (uint)*pbVar39;
              }
            }
            else {
              iVar8 = -(uint)bVar42;
            }
            puVar16 = puVar18;
            if (iVar8 < 1) goto LAB_001e3082;
            do {
              puVar16[-1] = *puVar16;
              puVar18 = puVar16 + 1;
              if (last <= puVar18) {
                puVar18 = puVar16 + 1;
                goto LAB_001e3082;
              }
              puVar16 = puVar18;
            } while ((int)*puVar18 < 0);
          } while( true );
        }
LAB_001e2f25:
        if ((int)local_208 < 0) {
          __assert_fail("0 <= ssize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb65e,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        if (local_208 == 0) {
          return;
        }
        local_208 = local_208 - 1;
        first = (int *)auStack_1b8[local_208 * 3];
        last = (int *)auStack_1b8[local_208 * 3 + 1];
        iVar40 = aiStack_1a8[local_208 * 6];
        uVar5 = (long)last - (long)first;
        uVar38 = (long)uVar5 >> 2;
      } while ((long)uVar38 < 9);
      puVar18 = (uint *)last;
      puVar6 = (uint *)first;
      iVar23 = aiStack_1a8[local_208 * 6 + 1];
    }
    iVar8 = iVar23 + -1;
    if (iVar23 == 0) {
      uVar37 = (uint)uVar38;
      uVar17 = uVar37;
      if ((uVar38 & 1) == 0) {
        uVar17 = uVar37 - 1;
        iVar9 = (int)((uVar37 - ((int)uVar17 >> 0x1f)) + -1) >> 1;
        uVar32 = puVar6[(long)(int)uVar37 + -1];
        if (T[(long)PA[(int)puVar6[iVar9]] + (long)iVar40] < T[(long)PA[(int)uVar32] + (long)iVar40]
           ) {
          puVar6[(long)(int)uVar37 + -1] = puVar6[iVar9];
          puVar6[iVar9] = uVar32;
        }
      }
      if (1 < (int)uVar17) {
        uVar36 = (ulong)(uVar17 >> 1);
        do {
          uVar35 = uVar36 - 1;
          uVar37 = puVar6[uVar36 - 1];
          uVar26 = uVar36 * 2 - 1;
          if ((long)uVar26 < (long)(ulong)uVar17) {
            bVar19 = T[(long)PA[(int)uVar37] + (long)iVar40];
            uVar15 = uVar36 * 2 - 2;
            uVar41 = uVar35 & 0xffffffff;
            do {
              uVar13 = (uint)uVar26;
              bVar1 = T[(long)PA[(int)puVar6[(int)uVar13]] + (long)iVar40];
              bVar2 = T[(long)PA[(int)puVar6[(long)(int)uVar15 + 2]] + (long)iVar40];
              bVar31 = bVar2;
              if (bVar2 < bVar1) {
                bVar31 = bVar1;
              }
              uVar32 = (uint)uVar41;
              if (bVar31 <= bVar19) break;
              if (bVar1 < bVar2) {
                uVar13 = (int)uVar15 + 2;
              }
              puVar6[(int)(uint)uVar41] = puVar6[(int)uVar13];
              uVar24 = uVar13 * 2 + 1;
              uVar26 = (ulong)uVar24;
              uVar15 = (ulong)(uVar13 * 2);
              uVar41 = (ulong)uVar13;
              uVar32 = uVar13;
            } while ((int)uVar24 < (int)uVar17);
          }
          else {
            uVar32 = (uint)uVar35;
          }
          puVar6[(int)uVar32] = uVar37;
          bVar43 = 1 < (long)uVar36;
          uVar36 = uVar35;
        } while (bVar43);
      }
      if ((uVar38 & 1) == 0) {
        uVar37 = *puVar6;
        *puVar6 = puVar6[(int)uVar17];
        puVar6[(int)uVar17] = uVar37;
        uVar37 = *puVar6;
        if ((int)uVar17 < 2) {
          lVar12 = 0;
        }
        else {
          bVar19 = T[(long)PA[(int)uVar37] + (long)iVar40];
          iVar9 = 0;
          iVar14 = 1;
          iVar25 = 0;
          do {
            bVar1 = T[(long)PA[(int)puVar6[iVar14]] + (long)iVar40];
            bVar2 = T[(long)PA[(int)puVar6[(long)iVar9 + 2]] + (long)iVar40];
            bVar31 = bVar2;
            if (bVar2 < bVar1) {
              bVar31 = bVar1;
            }
            iVar33 = iVar25;
            if (bVar31 <= bVar19) break;
            iVar33 = iVar14;
            if (bVar1 < bVar2) {
              iVar33 = iVar9 + 2;
            }
            puVar6[iVar25] = puVar6[iVar33];
            iVar14 = iVar33 * 2 + 1;
            iVar9 = iVar33 * 2;
            iVar25 = iVar33;
          } while (iVar14 < (int)uVar17);
          lVar12 = (long)iVar33;
        }
        puVar6[lVar12] = uVar37;
      }
      uVar38 = (ulong)uVar17;
      if (1 < (int)uVar17) {
        do {
          uVar36 = uVar38 - 1;
          uVar17 = *puVar6;
          uVar37 = puVar6[uVar38 - 1];
          *puVar6 = uVar37;
          if (uVar38 == 2) {
            lVar12 = 0;
          }
          else {
            bVar19 = T[(long)PA[(int)uVar37] + (long)iVar40];
            iVar9 = 0;
            iVar14 = 1;
            iVar25 = 0;
            do {
              bVar1 = T[(long)PA[(int)puVar6[iVar14]] + (long)iVar40];
              bVar2 = T[(long)PA[(int)puVar6[(long)iVar9 + 2]] + (long)iVar40];
              bVar31 = bVar2;
              if (bVar2 < bVar1) {
                bVar31 = bVar1;
              }
              iVar33 = iVar25;
              if (bVar31 <= bVar19) break;
              iVar33 = iVar14;
              if (bVar1 < bVar2) {
                iVar33 = iVar9 + 2;
              }
              puVar6[iVar25] = puVar6[iVar33];
              iVar14 = iVar33 * 2 + 1;
              iVar9 = iVar33 * 2;
              iVar25 = iVar33;
            } while ((long)iVar14 < (long)uVar36);
            lVar12 = (long)iVar33;
          }
          puVar6[lVar12] = uVar37;
          puVar6[uVar36] = uVar17;
          bVar43 = 2 < (long)uVar38;
          uVar38 = uVar36;
        } while (bVar43);
      }
    }
    iVar9 = (int)local_208;
    last = (int *)puVar18;
    if (0 < iVar23) {
      uVar17 = (uint)(uVar5 >> 2);
      puVar16 = puVar6 + ((int)(((uint)(uVar5 >> 0x21) & 1) + uVar17) >> 1);
      if ((int)uVar17 < 0x201) {
        if ((int)uVar17 < 0x21) {
          puVar27 = puVar16;
          if (T[(long)PA[(int)*puVar16] + (long)iVar40] < T[(long)PA[(int)*puVar6] + (long)iVar40])
          {
            puVar27 = puVar6;
          }
          if (T[(long)PA[(int)puVar18[-1]] + (long)iVar40] <
              T[(long)PA[(int)*puVar27] + (long)iVar40]) {
            if (T[(long)PA[(int)*puVar6] + (long)iVar40] <=
                T[(long)PA[(int)*puVar16] + (long)iVar40]) {
              puVar16 = puVar6;
            }
            puVar27 = puVar16;
            if (T[(long)PA[(int)*puVar16] + (long)iVar40] <=
                T[(long)PA[(int)puVar18[-1]] + (long)iVar40]) {
              puVar27 = puVar18 + -1;
            }
          }
        }
        else {
          uVar17 = (uint)(uVar5 >> 4);
          uVar5 = (ulong)(uVar17 << 2);
          puVar27 = puVar18 + -1;
          lVar12 = -(ulong)(uVar17 & 0x3fffffff);
          puVar28 = (uint *)((long)puVar27 - uVar5);
          puVar7 = puVar16;
          puVar30 = (uint *)((long)puVar6 + uVar5);
          if (T[(long)PA[(int)*puVar16] + (long)iVar40] <
              T[(long)PA[*(int *)((long)puVar6 + uVar5)] + (long)iVar40]) {
            puVar7 = (uint *)((long)puVar6 + uVar5);
            puVar30 = puVar16;
          }
          puVar16 = puVar27;
          if (T[(long)PA[(int)puVar18[-1]] + (long)iVar40] <
              T[(long)PA[(int)*puVar28] + (long)iVar40]) {
            puVar16 = puVar28;
            lVar12 = 0;
            puVar28 = puVar27;
          }
          puVar29 = puVar16;
          if (T[(long)PA[(int)puVar18[lVar12 + -1]] + (long)iVar40] <
              T[(long)PA[(int)*puVar30] + (long)iVar40]) {
            puVar29 = puVar7;
            puVar7 = puVar16;
            puVar28 = puVar30;
          }
          puVar16 = puVar7;
          puVar27 = puVar6;
          if (T[(long)PA[(int)*puVar7] + (long)iVar40] < T[(long)PA[(int)*puVar6] + (long)iVar40]) {
            puVar16 = puVar6;
            puVar27 = puVar7;
          }
          if (T[(long)PA[(int)*puVar27] + (long)iVar40] <= T[(long)PA[(int)*puVar28] + (long)iVar40]
             ) {
            puVar27 = puVar28;
            puVar29 = puVar16;
          }
          if (T[(long)PA[(int)*puVar29] + (long)iVar40] <= T[(long)PA[(int)*puVar27] + (long)iVar40]
             ) {
            puVar27 = puVar29;
          }
        }
      }
      else {
        uVar5 = uVar5 >> 5 & 0x1fffffff;
        puVar27 = puVar6 + uVar5;
        puVar7 = puVar27;
        if (T[(long)PA[(int)*puVar27] + (long)iVar40] < T[(long)PA[(int)*puVar6] + (long)iVar40]) {
          puVar7 = puVar6;
        }
        if (T[(long)PA[*(int *)((long)puVar6 + (ulong)(uVar17 & 0xfffffff8))] + (long)iVar40] <
            T[(long)PA[(int)*puVar7] + (long)iVar40]) {
          if (T[(long)PA[(int)*puVar6] + (long)iVar40] <= T[(long)PA[(int)*puVar27] + (long)iVar40])
          {
            puVar27 = puVar6;
          }
          puVar7 = puVar27;
          if (T[(long)PA[(int)*puVar27] + (long)iVar40] <=
              T[(long)PA[*(int *)((long)puVar6 + (ulong)(uVar17 & 0xfffffff8))] + (long)iVar40]) {
            puVar7 = (uint *)((ulong)(uVar17 & 0xfffffff8) + (long)puVar6);
          }
        }
        lVar22 = -uVar5;
        iVar25 = (int)uVar5;
        uVar38 = (ulong)(uint)(iVar25 * 4);
        puVar27 = (uint *)((long)puVar16 - uVar38);
        puVar28 = puVar16;
        lVar12 = 0;
        if (T[(long)PA[(int)*puVar16] + (long)iVar40] < T[(long)PA[(int)*puVar27] + (long)iVar40]) {
          puVar28 = puVar27;
          lVar12 = lVar22;
        }
        if (T[(long)PA[*(int *)((long)puVar16 + uVar38)] + (long)iVar40] <
            T[(long)PA[(int)puVar16[lVar12]] + (long)iVar40]) {
          if (T[(long)PA[(int)*puVar16] + (long)iVar40] < T[(long)PA[(int)*puVar27] + (long)iVar40])
          {
            puVar27 = puVar16;
          }
          puVar28 = puVar27;
          if (T[(long)PA[(int)*puVar27] + (long)iVar40] <=
              T[(long)PA[*(int *)((long)puVar16 + uVar38)] + (long)iVar40]) {
            puVar28 = (uint *)(uVar38 + (long)puVar16);
          }
        }
        puVar27 = (uint *)((long)(puVar18 + -1) - (ulong)(uint)(iVar25 << 3));
        puVar30 = puVar18 + (-1 - uVar5);
        puVar16 = puVar30;
        if (T[(long)PA[(int)*puVar30] + (long)iVar40] < T[(long)PA[(int)*puVar27] + (long)iVar40]) {
          puVar16 = puVar27;
          lVar22 = -(ulong)(uint)(iVar25 * 2);
        }
        if (T[(long)PA[(int)puVar18[-1]] + (long)iVar40] <
            T[(long)PA[(int)puVar18[lVar22 + -1]] + (long)iVar40]) {
          if (T[(long)PA[(int)*puVar30] + (long)iVar40] < T[(long)PA[(int)*puVar27] + (long)iVar40])
          {
            puVar27 = puVar30;
          }
          puVar16 = puVar18 + -1;
          if (T[(long)PA[(int)puVar18[-1]] + (long)iVar40] <
              T[(long)PA[(int)*puVar27] + (long)iVar40]) {
            puVar16 = puVar27;
          }
        }
        puVar27 = puVar28;
        if (T[(long)PA[(int)*puVar28] + (long)iVar40] < T[(long)PA[(int)*puVar7] + (long)iVar40]) {
          puVar27 = puVar7;
        }
        if (T[(long)PA[(int)*puVar16] + (long)iVar40] < T[(long)PA[(int)*puVar27] + (long)iVar40]) {
          if (T[(long)PA[(int)*puVar28] + (long)iVar40] < T[(long)PA[(int)*puVar7] + (long)iVar40])
          {
            puVar7 = puVar28;
          }
          puVar27 = puVar16;
          if (T[(long)PA[(int)*puVar16] + (long)iVar40] < T[(long)PA[(int)*puVar7] + (long)iVar40])
          {
            puVar27 = puVar7;
          }
        }
      }
      bVar19 = T[(long)PA[(int)*puVar27] + (long)iVar40];
      uVar17 = *puVar6;
      *puVar6 = *puVar27;
      *puVar27 = uVar17;
      puVar16 = puVar6 + 1;
      bVar43 = puVar16 < puVar18;
      if ((bVar43) && (bVar20 = T[(long)PA[(int)*puVar16] + (long)iVar40], bVar20 == bVar19)) {
        puVar27 = puVar6 + 2;
        do {
          puVar16 = puVar27;
          bVar43 = puVar16 < puVar18;
          if (!bVar43) break;
          bVar20 = T[(long)PA[(int)*puVar16] + (long)iVar40];
          puVar27 = puVar16 + 1;
        } while (bVar20 == bVar19);
      }
      puVar27 = puVar16;
      if ((bVar43) && (bVar20 < bVar19)) {
        while (puVar16 = puVar16 + 1, puVar16 < puVar18) {
          uVar17 = *puVar16;
          bVar20 = T[(long)PA[(int)uVar17] + (long)iVar40];
          if (bVar19 < bVar20) break;
          if (bVar20 == bVar19) {
            *puVar16 = *puVar27;
            *puVar27 = uVar17;
            puVar27 = puVar27 + 1;
          }
        }
      }
      puVar7 = puVar18 + -1;
      bVar43 = puVar16 < puVar7;
      if ((bVar43) && (bVar20 = T[(long)PA[(int)*puVar7] + (long)iVar40], bVar20 == bVar19)) {
        puVar28 = puVar18 + -2;
        do {
          puVar7 = puVar28;
          bVar43 = puVar16 < puVar7;
          if (!bVar43) break;
          bVar20 = T[(long)PA[(int)*puVar7] + (long)iVar40];
          puVar28 = puVar7 + -1;
        } while (bVar20 == bVar19);
      }
      puVar28 = puVar7;
      if ((bVar43) && (bVar19 < bVar20)) {
        while (puVar7 = puVar7 + -1, puVar16 < puVar7) {
          uVar17 = *puVar7;
          bVar20 = T[(long)PA[(int)uVar17] + (long)iVar40];
          if (bVar20 < bVar19) break;
          if (bVar20 == bVar19) {
            *puVar7 = *puVar28;
            *puVar28 = uVar17;
            puVar28 = puVar28 + -1;
          }
        }
      }
LAB_001e3a1e:
      if (puVar16 < puVar7) {
        uVar17 = *puVar16;
        *puVar16 = *puVar7;
        *puVar7 = uVar17;
        while (puVar16 = puVar16 + 1, puVar16 < puVar7) {
          uVar17 = *puVar16;
          bVar20 = T[(long)PA[(int)uVar17] + (long)iVar40];
          if (bVar19 < bVar20) break;
          if (bVar20 == bVar19) {
            *puVar16 = *puVar27;
            *puVar27 = uVar17;
            puVar27 = puVar27 + 1;
          }
        }
LAB_001e3a04:
        puVar7 = puVar7 + -1;
        if (puVar16 < puVar7) {
          uVar17 = *puVar7;
          bVar20 = T[(long)PA[(int)uVar17] + (long)iVar40];
          if (bVar20 < bVar19) goto LAB_001e3a1e;
          if (bVar20 == bVar19) {
            *puVar7 = *puVar28;
            *puVar28 = uVar17;
            puVar28 = puVar28 + -1;
          }
          goto LAB_001e3a04;
        }
        goto LAB_001e3a1e;
      }
      if (puVar28 < puVar27) {
        iVar8 = iVar23;
        if (T[(long)PA[(int)*puVar6] + (long)iVar40 + -1] < bVar19) {
          puVar16 = puVar6 + -1;
          puVar27 = puVar18;
          do {
            while ((puVar16 = puVar16 + 1, puVar16 < puVar27 &&
                   (uVar17 = *puVar16, PA[(long)(int)uVar17 + 1] < PA[(int)uVar17] + iVar40))) {
              *puVar16 = ~uVar17;
            }
            do {
              puVar27 = puVar27 + -1;
              if (puVar27 <= puVar16) {
                if (puVar6 < puVar16) {
                  *puVar6 = ~*puVar6;
                }
                uVar17 = (uint)((long)puVar18 - (long)puVar16);
                puVar6 = puVar16;
                if (((long)puVar18 - (long)puVar16 & 0x3fc00U) == 0) {
                  iVar8 = *(int *)((long)lg_table + (ulong)(uVar17 & 0x3fc));
                }
                else {
                  iVar8 = *(int *)((long)lg_table + (ulong)(uVar17 >> 8 & 0x3fc)) + 8;
                }
                goto LAB_001e3e24;
              }
              uVar17 = *puVar27;
            } while (PA[(int)uVar17] + iVar40 <= PA[(long)(int)uVar17 + 1]);
            *puVar27 = *puVar16;
            *puVar16 = ~uVar17;
          } while( true );
        }
LAB_001e3e24:
        iVar40 = iVar40 + 1;
        first = (int *)puVar6;
        goto LAB_001e2eef;
      }
      lVar12 = (long)puVar16 - (long)puVar27 >> 2;
      uVar17 = (uint)((ulong)((long)puVar27 - (long)puVar6) >> 2);
      if ((int)(uint)lVar12 <= (int)uVar17) {
        uVar17 = (uint)lVar12;
      }
      if (0 < (int)uVar17) {
        iVar23 = uVar17 + 1;
        lVar22 = 0;
        do {
          uVar3 = *(undefined4 *)((long)puVar6 + lVar22);
          *(undefined4 *)((long)puVar6 + lVar22) =
               *(undefined4 *)((long)puVar16 + lVar22 + (ulong)uVar17 * -4);
          *(undefined4 *)((long)puVar16 + lVar22 + (ulong)uVar17 * -4) = uVar3;
          iVar23 = iVar23 + -1;
          lVar22 = lVar22 + 4;
        } while (1 < iVar23);
      }
      uVar5 = (long)puVar28 - (long)(puVar16 + -1) >> 2;
      uVar17 = (int)((ulong)((long)puVar18 - (long)puVar28) >> 2) - 1;
      uVar38 = (ulong)uVar17;
      if ((int)uVar5 <= (int)uVar17) {
        uVar38 = uVar5 & 0xffffffff;
      }
      if (0 < (int)uVar38) {
        iVar23 = (int)uVar38 + 1;
        lVar22 = 0;
        do {
          uVar3 = *(undefined4 *)((long)puVar16 + lVar22);
          *(undefined4 *)((long)puVar16 + lVar22) =
               *(undefined4 *)((long)puVar18 + lVar22 + uVar38 * -4);
          *(undefined4 *)((long)puVar18 + lVar22 + uVar38 * -4) = uVar3;
          iVar23 = iVar23 + -1;
          lVar22 = lVar22 + 4;
        } while (1 < iVar23);
      }
      puVar16 = puVar6 + lVar12;
      last = (int *)(puVar18 + -uVar5);
      first = (int *)puVar16;
      if (T[(long)PA[(int)*puVar16] + (long)iVar40 + -1] < bVar19) {
        first = (int *)(puVar16 + -1);
        puVar27 = (uint *)last;
        do {
          while ((first = (int *)((uint *)first + 1), first < puVar27 &&
                 (uVar17 = *first, PA[(long)(int)uVar17 + 1] < PA[(int)uVar17] + iVar40))) {
            *first = ~uVar17;
          }
          do {
            puVar27 = puVar27 + -1;
            if (puVar27 <= first) {
              if (puVar16 < first) {
                *puVar16 = ~*puVar16;
              }
              goto LAB_001e3c22;
            }
            uVar17 = *puVar27;
          } while (PA[(int)uVar17] + iVar40 <= PA[(long)(int)uVar17 + 1]);
          *puVar27 = *first;
          *first = ~uVar17;
        } while( true );
      }
LAB_001e3c22:
      uVar36 = (long)last - (long)first;
      uVar38 = (long)uVar36 >> 2;
      bVar19 = (byte)(uVar38 >> 8);
      if ((long)uVar5 < lVar12) {
        if (lVar12 <= (long)uVar38) {
          if (0xf < iVar9) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6b8,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar12 = (long)iVar9;
          auStack_1b8[lVar12 * 3] = (ulong)first;
          auStack_1b8[lVar12 * 3 + 1] = (ulong)last;
          aiStack_1a8[lVar12 * 6] = iVar40 + 1;
          if ((uVar36 & 0x3fc00) == 0) {
            iVar23 = lg_table[uVar38 & 0xff];
          }
          else {
            iVar23 = lg_table[bVar19] + 8;
          }
          aiStack_1a8[lVar12 * 6 + 1] = iVar23;
          if (iVar9 == 0xf) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6b9,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar12 = (long)(iVar9 + 1);
          auStack_1b8[lVar12 * 3] = (ulong)puVar6;
          auStack_1b8[lVar12 * 3 + 1] = (ulong)puVar16;
          aiStack_1a8[lVar12 * 6] = iVar40;
          local_208 = (ulong)(iVar9 + 2);
          aiStack_1a8[lVar12 * 6 + 1] = iVar8;
          first = last;
          last = (int *)puVar18;
          goto LAB_001e2eef;
        }
        if ((long)uVar38 < (long)uVar5) {
          if (0xf < iVar9) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6c0,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar12 = (long)iVar9;
          auStack_1b8[lVar12 * 3] = (ulong)puVar6;
          auStack_1b8[lVar12 * 3 + 1] = (ulong)puVar16;
          aiStack_1a8[lVar12 * 6] = iVar40;
          aiStack_1a8[lVar12 * 6 + 1] = iVar8;
          if (iVar9 == 0xf) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6c1,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar12 = (long)(iVar9 + 1);
          auStack_1b8[lVar12 * 3] = (ulong)last;
          auStack_1b8[lVar12 * 3 + 1] = (ulong)puVar18;
          aiStack_1a8[lVar12 * 6] = iVar40;
          local_208 = (ulong)(iVar9 + 2);
          aiStack_1a8[lVar12 * 6 + 1] = iVar8;
          iVar40 = iVar40 + 1;
          if ((uVar36 & 0x3fc00) == 0) {
            iVar8 = lg_table[uVar38 & 0xff];
          }
          else {
            iVar8 = lg_table[bVar19] + 8;
          }
          goto LAB_001e2eef;
        }
        if (0xf < iVar9) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb6bc,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        lVar12 = (long)iVar9;
        auStack_1b8[lVar12 * 3] = (ulong)puVar6;
        auStack_1b8[lVar12 * 3 + 1] = (ulong)puVar16;
        aiStack_1a8[lVar12 * 6] = iVar40;
        aiStack_1a8[lVar12 * 6 + 1] = iVar8;
        if (iVar9 == 0xf) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb6bd,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        lVar12 = (long)(iVar9 + 1);
        auStack_1b8[lVar12 * 3] = (ulong)first;
        auStack_1b8[lVar12 * 3 + 1] = (ulong)last;
        aiStack_1a8[lVar12 * 6] = iVar40 + 1;
        if ((uVar36 & 0x3fc00) == 0) {
          iVar23 = lg_table[uVar38 & 0xff];
        }
        else {
          iVar23 = lg_table[bVar19] + 8;
        }
        aiStack_1a8[lVar12 * 6 + 1] = iVar23;
        puVar6 = (uint *)last;
        puVar16 = puVar18;
      }
      else {
        if ((long)uVar5 <= (long)uVar38) {
          if (0xf < iVar9) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6aa,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar12 = (long)iVar9;
          auStack_1b8[lVar12 * 3] = (ulong)first;
          auStack_1b8[lVar12 * 3 + 1] = (ulong)last;
          aiStack_1a8[lVar12 * 6] = iVar40 + 1;
          if ((uVar36 & 0x3fc00) == 0) {
            iVar23 = lg_table[uVar38 & 0xff];
          }
          else {
            iVar23 = lg_table[bVar19] + 8;
          }
          aiStack_1a8[lVar12 * 6 + 1] = iVar23;
          if (iVar9 == 0xf) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6ab,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar12 = (long)(iVar9 + 1);
          auStack_1b8[lVar12 * 3] = (ulong)last;
          auStack_1b8[lVar12 * 3 + 1] = (ulong)puVar18;
          aiStack_1a8[lVar12 * 6] = iVar40;
          local_208 = (ulong)(iVar9 + 2);
          aiStack_1a8[lVar12 * 6 + 1] = iVar8;
          first = (int *)puVar6;
          last = (int *)puVar16;
          goto LAB_001e2eef;
        }
        if ((long)uVar38 < lVar12) {
          if (0xf < iVar9) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6b2,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar12 = (long)iVar9;
          auStack_1b8[lVar12 * 3] = (ulong)last;
          auStack_1b8[lVar12 * 3 + 1] = (ulong)puVar18;
          aiStack_1a8[lVar12 * 6] = iVar40;
          aiStack_1a8[lVar12 * 6 + 1] = iVar8;
          if (iVar9 == 0xf) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb6b3,
                          "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)"
                         );
          }
          lVar12 = (long)(iVar9 + 1);
          auStack_1b8[lVar12 * 3] = (ulong)puVar6;
          auStack_1b8[lVar12 * 3 + 1] = (ulong)puVar16;
          aiStack_1a8[lVar12 * 6] = iVar40;
          local_208 = (ulong)(iVar9 + 2);
          aiStack_1a8[lVar12 * 6 + 1] = iVar8;
          iVar40 = iVar40 + 1;
          if ((uVar36 & 0x3fc00) == 0) {
            iVar8 = lg_table[uVar38 & 0xff];
          }
          else {
            iVar8 = lg_table[bVar19] + 8;
          }
          goto LAB_001e2eef;
        }
        if (0xf < iVar9) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb6ae,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        lVar12 = (long)iVar9;
        auStack_1b8[lVar12 * 3] = (ulong)last;
        auStack_1b8[lVar12 * 3 + 1] = (ulong)puVar18;
        aiStack_1a8[lVar12 * 6] = iVar40;
        aiStack_1a8[lVar12 * 6 + 1] = iVar8;
        if (iVar9 == 0xf) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb6af,
                        "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)")
          ;
        }
        lVar12 = (long)(iVar9 + 1);
        auStack_1b8[lVar12 * 3] = (ulong)first;
        auStack_1b8[lVar12 * 3 + 1] = (ulong)last;
        aiStack_1a8[lVar12 * 6] = iVar40 + 1;
        if ((uVar36 & 0x3fc00) == 0) {
          iVar23 = lg_table[uVar38 & 0xff];
        }
        else {
          iVar23 = lg_table[bVar19] + 8;
        }
        aiStack_1a8[lVar12 * 6 + 1] = iVar23;
      }
      local_208 = (ulong)(iVar9 + 2);
      first = (int *)puVar6;
      last = (int *)puVar16;
      goto LAB_001e2eef;
    }
    bVar19 = T[(long)PA[(int)*puVar6] + (long)iVar40];
    puVar27 = puVar6;
    puVar16 = puVar6;
    do {
      puVar7 = puVar27;
      bVar1 = bVar19;
      puVar16 = puVar16 + 1;
      if (puVar18 <= puVar16) break;
      puVar6 = puVar6 + 1;
      bVar20 = T[(long)PA[(int)*puVar16] + (long)iVar40];
      bVar19 = bVar1;
      puVar27 = puVar7;
    } while ((bVar1 == bVar20) ||
            (bVar19 = bVar20, puVar27 = puVar16, (long)puVar6 - (long)puVar7 < 5));
    puVar6 = puVar7;
    if (T[(long)PA[(int)*puVar7] + (long)iVar40 + -1] < bVar1) {
      puVar6 = puVar7 + -1;
      puVar27 = puVar16;
      do {
        while ((puVar6 = puVar6 + 1, puVar6 < puVar27 &&
               (uVar17 = *puVar6, PA[(long)(int)uVar17 + 1] < PA[(int)uVar17] + iVar40))) {
          *puVar6 = ~uVar17;
        }
        do {
          puVar27 = puVar27 + -1;
          if (puVar27 <= puVar6) {
            if (puVar7 < puVar6) {
              *puVar7 = ~*puVar7;
            }
            goto LAB_001e36d4;
          }
          uVar17 = *puVar27;
        } while (PA[(int)uVar17] + iVar40 <= PA[(long)(int)uVar17 + 1]);
        *puVar27 = *puVar6;
        *puVar6 = ~uVar17;
      } while( true );
    }
LAB_001e36d4:
    uVar38 = (long)puVar16 - (long)puVar6;
    uVar5 = (long)uVar38 >> 2;
    lVar12 = (long)puVar18 - (long)puVar16 >> 2;
    bVar19 = (byte)(uVar5 >> 8);
    first = (int *)puVar16;
    if ((long)uVar5 <= lVar12) goto LAB_001e3744;
    if (lVar12 < 2) goto LAB_001e3786;
    if (0xf < iVar9) {
      __assert_fail("ssize < STACK_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xb678,
                    "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)");
    }
    lVar12 = (long)iVar9;
    auStack_1b8[lVar12 * 3] = (ulong)puVar6;
    auStack_1b8[lVar12 * 3 + 1] = (ulong)puVar16;
    aiStack_1a8[lVar12 * 6] = iVar40 + 1;
    if ((uVar38 & 0x3fc00) == 0) {
      iVar8 = lg_table[uVar5 & 0xff];
    }
    else {
      iVar8 = lg_table[bVar19] + 8;
    }
    local_208 = (ulong)(iVar9 + 1);
    aiStack_1a8[lVar12 * 6 + 1] = iVar8;
    iVar8 = -1;
  } while( true );
LAB_001e3082:
  if (iVar8 == 0) {
    *puVar18 = ~*puVar18;
  }
  puVar18[-1] = uVar17;
  puVar6 = puVar6 + -1;
  if (puVar6 < first) goto LAB_001e2f25;
  goto LAB_001e2f80;
LAB_001e3744:
  iVar8 = -1;
  if (1 < (long)uVar5) {
    if (0xf < iVar9) {
      __assert_fail("ssize < STACK_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xb671,
                    "void ss_mintrosort(const unsigned char *, const int *, int *, int *, int)");
    }
    lVar12 = (long)iVar9;
    auStack_1b8[lVar12 * 3] = (ulong)puVar16;
    auStack_1b8[lVar12 * 3 + 1] = (ulong)puVar18;
    aiStack_1a8[lVar12 * 6] = iVar40;
    local_208 = (ulong)(iVar9 + 1);
    aiStack_1a8[lVar12 * 6 + 1] = -1;
LAB_001e3786:
    iVar40 = iVar40 + 1;
    first = (int *)puVar6;
    last = (int *)puVar16;
    if ((uVar38 & 0x3fc00) == 0) {
      iVar8 = lg_table[uVar5 & 0xff];
    }
    else {
      iVar8 = lg_table[bVar19] + 8;
    }
  }
  goto LAB_001e2eef;
}

Assistant:

static
void
ss_mintrosort(const unsigned char *T, const int *PA,
              int *first, int *last,
              int depth) {
#define STACK_SIZE SS_MISORT_STACKSIZE
  struct { int *a, *b, c; int d; } stack[STACK_SIZE];
  const unsigned char *Td;
  int *a, *b, *c, *d, *e, *f;
  int s, t;
  int ssize;
  int limit;
  int v, x = 0;

  for(ssize = 0, limit = ss_ilg(last - first);;) {

    if((last - first) <= SS_INSERTIONSORT_THRESHOLD) {
#if 1 < SS_INSERTIONSORT_THRESHOLD
      if(1 < (last - first)) { ss_insertionsort(T, PA, first, last, depth); }
#endif
      STACK_POP(first, last, depth, limit);
      continue;
    }

    Td = T + depth;
    if(limit-- == 0) { ss_heapsort(Td, PA, first, last - first); }
    if(limit < 0) {
      for(a = first + 1, v = Td[PA[*first]]; a < last; ++a) {
        if((x = Td[PA[*a]]) != v) {
          if(1 < (a - first)) { break; }
          v = x;
          first = a;
        }
      }
      if(Td[PA[*first] - 1] < v) {
        first = ss_partition(PA, first, a, depth);
      }
      if((a - first) <= (last - a)) {
        if(1 < (a - first)) {
          STACK_PUSH(a, last, depth, -1);
          last = a, depth += 1, limit = ss_ilg(a - first);
        } else {
          first = a, limit = -1;
        }
      } else {
        if(1 < (last - a)) {
          STACK_PUSH(first, a, depth + 1, ss_ilg(a - first));
          first = a, limit = -1;
        } else {
          last = a, depth += 1, limit = ss_ilg(a - first);
        }
      }
      continue;
    }

    /* choose pivot */
    a = ss_pivot(Td, PA, first, last);
    v = Td[PA[*a]];
    SWAP(*first, *a);

    /* partition */
    for(b = first; (++b < last) && ((x = Td[PA[*b]]) == v);) { }
    if(((a = b) < last) && (x < v)) {
      for(; (++b < last) && ((x = Td[PA[*b]]) <= v);) {
        if(x == v) { SWAP(*b, *a); ++a; }
      }
    }
    for(c = last; (b < --c) && ((x = Td[PA[*c]]) == v);) { }
    if((b < (d = c)) && (x > v)) {
      for(; (b < --c) && ((x = Td[PA[*c]]) >= v);) {
        if(x == v) { SWAP(*c, *d); --d; }
      }
    }
    for(; b < c;) {
      SWAP(*b, *c);
      for(; (++b < c) && ((x = Td[PA[*b]]) <= v);) {
        if(x == v) { SWAP(*b, *a); ++a; }
      }
      for(; (b < --c) && ((x = Td[PA[*c]]) >= v);) {
        if(x == v) { SWAP(*c, *d); --d; }
      }
    }

    if(a <= d) {
      c = b - 1;

      if((s = a - first) > (t = b - a)) { s = t; }
      for(e = first, f = b - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
      if((s = d - c) > (t = last - d - 1)) { s = t; }
      for(e = b, f = last - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }

      a = first + (b - a), c = last - (d - c);
      b = (v <= Td[PA[*a] - 1]) ? a : ss_partition(PA, a, c, depth);

      if((a - first) <= (last - c)) {
        if((last - c) <= (c - b)) {
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          STACK_PUSH(c, last, depth, limit);
          last = a;
        } else if((a - first) <= (c - b)) {
          STACK_PUSH(c, last, depth, limit);
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          last = a;
        } else {
          STACK_PUSH(c, last, depth, limit);
          STACK_PUSH(first, a, depth, limit);
          first = b, last = c, depth += 1, limit = ss_ilg(c - b);
        }
      } else {
        if((a - first) <= (c - b)) {
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          STACK_PUSH(first, a, depth, limit);
          first = c;
        } else if((last - c) <= (c - b)) {
          STACK_PUSH(first, a, depth, limit);
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          first = c;
        } else {
          STACK_PUSH(first, a, depth, limit);
          STACK_PUSH(c, last, depth, limit);
          first = b, last = c, depth += 1, limit = ss_ilg(c - b);
        }
      }
    } else {
      limit += 1;
      if(Td[PA[*first] - 1] < v) {
        first = ss_partition(PA, first, last, depth);
        limit = ss_ilg(last - first);
      }
      depth += 1;
    }
  }
#undef STACK_SIZE
}